

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

string_t duckdb::BlobSliceOperations::SliceValueWithSteps
                   (Vector *result,SelectionVector *sel,string_t input,int64_t begin,int64_t end,
                   int64_t step,idx_t *sel_idx)

{
  InternalException *this;
  string local_40;
  
  this = (InternalException *)__cxa_allocate_exception(0x10,sel,input.value._0_8_,input.value._8_8_)
  ;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Slicing with steps is not supported for strings","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string_t SliceValueWithSteps(Vector &result, SelectionVector &sel, string_t input, int64_t begin,
	                                    int64_t end, int64_t step, idx_t &sel_idx) {
		throw InternalException("Slicing with steps is not supported for strings");
	}